

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

void __thiscall Api::startGame(Api *this)

{
  string in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd8,"tst",(allocator *)&stack0xffffffffffffffd7);
  initFromFile(this,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  GameManager::shuffleDecks(&this->_game);
  GameManager::start(&this->_game);
  return;
}

Assistant:

void Api::startGame() {
    this->initFromFile("tst");
    this->_game.shuffleDecks();
    this->_game.start();
}